

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O2

void __thiscall util::logging::Msg::Msg(Msg *this,string *txt,M_Level lvl)

{
  this->_vptr_Msg = (_func_int **)&PTR__Msg_00121b38;
  std::__cxx11::string::string((string *)&this->msg_txt,(string *)txt);
  this->msg_lvl = lvl;
  return;
}

Assistant:

Msg::Msg( const std::string & txt, M_Level lvl ) :
			msg_txt(txt), msg_lvl(lvl)
		{
		}